

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
pbrt::GBufferFilm::AddSample
          (GBufferFilm *this,Point2i pFilm,SampledSpectrum L,SampledWavelengths *lambda,
          VisibleSurface *visibleSurface,Float weight)

{
  initializer_list<float> __l;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Point3f p_00;
  Normal3f n;
  Normal3f n_00;
  Vector3f v;
  Vector3f v_00;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Normal3f n_01;
  Vector3f v_01;
  Normal3<float> c_00;
  Normal3<float> c_01;
  Normal3<float> c_02;
  Point3<float> c_03;
  bool bVar11;
  Float *pFVar12;
  VisibleSurface *in_RCX;
  Tuple2<pbrt::Point2,_int> in_RSI;
  long in_RDI;
  AnimatedTransform *this_00;
  undefined8 uVar24;
  undefined1 in_ZMM0 [64];
  undefined1 auVar25 [56];
  undefined1 auVar13 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar28 [56];
  undefined1 auVar27 [64];
  float in_XMM2_Da;
  RGB RVar29;
  Point3f PVar30;
  Point3<float> PVar31;
  Normal3f NVar32;
  Normal3<float> NVar33;
  Vector3f VVar34;
  SampledSpectrum SVar35;
  int c_2;
  int c_1;
  RGB albedoRGB;
  SampledSpectrum albedo;
  int c;
  Pixel *p;
  Float m;
  RGB rgb;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  float fVar36;
  SampledSpectrum *this_01;
  float in_stack_fffffffffffff974;
  SampledWavelengths *in_stack_fffffffffffff978;
  DenselySampledSpectrum *in_stack_fffffffffffff980;
  Tuple3<pbrt::Point3,_float> in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff9b0;
  float in_stack_fffffffffffff9b4;
  SampledWavelengths *in_stack_fffffffffffff9b8;
  SampledSpectrum *in_stack_fffffffffffff9c0;
  SampledWavelengths *in_stack_fffffffffffffa40;
  PixelSensor *in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa50;
  Float in_stack_fffffffffffffa54;
  float fVar37;
  AnimatedTransform *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  float fVar38;
  float in_stack_fffffffffffffa78;
  undefined4 uStack_580;
  Float in_stack_fffffffffffffa84;
  AnimatedTransform *in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffaa0;
  float in_stack_fffffffffffffaa8;
  undefined4 uStack_554;
  int local_548;
  int local_544;
  RGB local_52c;
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_510;
  undefined8 local_508;
  Tuple2<pbrt::Point2,_float> local_500;
  Tuple2<pbrt::Point2,_float> local_4f8;
  undefined8 local_4f0;
  float local_4e8;
  undefined8 local_4e0;
  float local_4d8;
  undefined8 local_4d0;
  float local_4c8;
  undefined8 local_4c4;
  float local_4bc;
  undefined8 local_4b8;
  float local_4b0;
  undefined8 local_4a8;
  float local_4a0;
  undefined8 local_498;
  float local_490;
  undefined8 local_488;
  float local_480;
  undefined8 local_478;
  float local_470;
  undefined8 local_468;
  float local_460;
  undefined8 local_458;
  float local_450;
  undefined8 local_448;
  float local_440;
  undefined8 local_438;
  float local_430;
  undefined8 local_428;
  float local_420;
  undefined8 local_418;
  float local_410;
  undefined8 local_408;
  float local_400;
  undefined8 local_3f8;
  float local_3f0;
  undefined8 local_3e8;
  float local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  undefined8 local_3c8;
  float local_3c0;
  undefined8 local_3b8;
  float local_3b0;
  undefined8 local_3a8;
  float local_3a0;
  undefined8 local_398;
  float local_390;
  undefined8 local_388;
  float local_380;
  undefined8 local_378;
  float local_370;
  undefined8 local_368;
  float local_360;
  undefined8 local_358;
  float local_350;
  undefined8 local_348;
  float local_340;
  undefined8 local_338;
  float local_330;
  undefined8 local_328;
  float local_320;
  undefined8 local_318;
  float local_310;
  undefined8 local_308;
  float local_300;
  undefined8 local_2f8;
  float local_2f0;
  undefined8 local_2e8;
  float local_2e0;
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2c8;
  float local_2c0;
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_29c;
  float local_294;
  undefined8 local_290;
  float local_288;
  undefined8 local_280;
  float local_278;
  undefined8 local_270;
  float local_268;
  undefined8 local_260;
  float local_258;
  undefined8 local_250;
  float local_248;
  undefined8 local_240;
  float local_238;
  undefined8 local_230;
  float local_228;
  undefined8 local_220;
  float local_218;
  undefined8 local_210;
  float local_208;
  undefined8 local_200;
  float local_1f8;
  undefined8 local_1f0;
  float local_1e8;
  undefined8 local_1e0;
  float local_1d8;
  undefined8 local_1d0;
  float local_1c8;
  undefined8 local_1c0;
  float local_1b8;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_1a0;
  float local_198;
  undefined8 local_190;
  float local_188;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  float local_168;
  undefined8 local_160;
  float local_158;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  int local_a4;
  Tuple2<pbrt::Point2,_int> local_a0;
  Pixel *local_98;
  Float local_8c;
  Float local_88;
  Float local_84;
  Float *local_80;
  undefined8 local_78;
  float local_6c;
  RGB local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  RGB local_40;
  float local_34;
  VisibleSurface *local_30;
  undefined8 local_18;
  undefined8 uStack_10;
  Tuple2<pbrt::Point2,_int> local_8;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar21 [64];
  undefined1 extraout_var [56];
  undefined1 auVar26 [64];
  
  local_58 = vmovlpd_avx(in_ZMM0._0_16_);
  uStack_50 = vmovlpd_avx(in_ZMM1._0_16_);
  auVar25 = ZEXT856(0);
  SVar35.values.values[1] = in_stack_fffffffffffffa54;
  SVar35.values.values[0] = (float)in_stack_fffffffffffffa50;
  SVar35.values.values._8_8_ = in_stack_fffffffffffffa58;
  local_34 = in_XMM2_Da;
  local_30 = in_RCX;
  local_18 = local_58;
  uStack_10 = uStack_50;
  local_8 = in_RSI;
  RVar29 = PixelSensor::ToSensorRGB(in_stack_fffffffffffffa48,SVar35,in_stack_fffffffffffffa40);
  local_84 = RVar29.b;
  auVar13._0_8_ = RVar29._0_8_;
  auVar13._8_56_ = auVar25;
  local_68._0_8_ = vmovlpd_avx(auVar13._0_16_);
  local_40.r = local_68.r;
  local_8c = local_40.r;
  local_40.g = local_68.g;
  local_88 = local_40.g;
  local_80 = &local_8c;
  local_78 = 3;
  __l._M_len._0_4_ = in_stack_fffffffffffff960;
  __l._M_array = (iterator)in_stack_fffffffffffff958;
  __l._M_len._4_4_ = in_stack_fffffffffffff964;
  local_68.b = local_84;
  local_40._0_8_ = local_68._0_8_;
  local_40.b = local_84;
  local_6c = std::max<float>(__l);
  if (*(float *)(in_RDI + 0x338) < local_6c) {
    RGB::operator*=(&local_40,*(float *)(in_RDI + 0x338) / local_6c);
  }
  local_a0 = local_8;
  local_98 = Array2D<pbrt::GBufferFilm::Pixel>::operator[]
                       ((Array2D<pbrt::GBufferFilm::Pixel> *)(in_RDI + 0x310),(Point2i)local_8);
  if ((local_30 != (VisibleSurface *)0x0) &&
     (bVar11 = VisibleSurface::operator_cast_to_bool(local_30), bVar11)) {
    local_98->gBufferWeightSum = (double)local_34 + local_98->gBufferWeightSum;
    for (local_a4 = 0; local_a4 < 3; local_a4 = local_a4 + 1) {
      in_stack_fffffffffffffaa8 = SUB84(local_98->rgbVariance + local_a4,0);
      uStack_554 = (undefined4)((ulong)(local_98->rgbVariance + local_a4) >> 0x20);
      pFVar12 = RGB::operator[](&local_40,local_a4);
      VarianceEstimator<float>::Add
                ((VarianceEstimator<float> *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8),*pFVar12
                );
    }
    if ((*(byte *)(in_RDI + 0x308) & 1) == 0) {
      local_310 = (local_30->p).super_Tuple3<pbrt::Point3,_float>.z;
      local_318._0_4_ = (local_30->p).super_Tuple3<pbrt::Point3,_float>.x;
      local_318._4_4_ = (local_30->p).super_Tuple3<pbrt::Point3,_float>.y;
      in_stack_fffffffffffff980 = (DenselySampledSpectrum *)0x0;
      PVar30.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffaa8;
      PVar30.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffaa0;
      PVar30.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
      fVar36 = local_34;
      local_308 = local_318;
      local_300 = local_310;
      PVar30 = AnimatedTransform::operator()
                         (in_stack_fffffffffffffa88,PVar30,in_stack_fffffffffffffa84);
      local_330 = PVar30.super_Tuple3<pbrt::Point3,_float>.z;
      in_stack_fffffffffffff978 = PVar30.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar25 = (undefined1  [56])0x0;
      auVar1._8_8_ = in_stack_fffffffffffff980;
      auVar1._0_8_ = in_stack_fffffffffffff978;
      local_338 = vmovlpd_avx(auVar1);
      local_328 = local_338;
      local_320 = local_330;
      local_2f8 = local_338;
      local_2f0 = local_330;
      local_2e8 = local_338;
      local_2e0 = local_330;
      PVar31 = pbrt::operator*(fVar36,in_stack_fffffffffffff988);
      local_350 = PVar31.super_Tuple3<pbrt::Point3,_float>.z;
      auVar17._0_8_ = PVar31.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar17._8_56_ = auVar25;
      local_358 = vmovlpd_avx(auVar17._0_16_);
      PVar31.super_Tuple3<pbrt::Point3,_float>.z = local_350;
      PVar31.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_358;
      PVar31.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)local_358 >> 0x20);
      local_348 = local_358;
      local_340 = local_350;
      local_2d8 = local_358;
      local_2d0 = local_350;
      Tuple3<pbrt::Point3,float>::operator+=((Tuple3<pbrt::Point3,float> *)&local_98->pSum,PVar31);
      local_3a0 = (local_30->n).super_Tuple3<pbrt::Normal3,_float>.z;
      local_3a8._0_4_ = (local_30->n).super_Tuple3<pbrt::Normal3,_float>.x;
      local_3a8._4_4_ = (local_30->n).super_Tuple3<pbrt::Normal3,_float>.y;
      uVar24 = 0;
      NVar32.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffaa8;
      NVar32.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffffaa0;
      NVar32.super_Tuple3<pbrt::Normal3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
      local_398 = local_3a8;
      local_390 = local_3a0;
      NVar32 = AnimatedTransform::operator()
                         (in_stack_fffffffffffffa88,NVar32,in_stack_fffffffffffffa84);
      local_3c0 = NVar32.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar25 = (undefined1  [56])0x0;
      auVar2._8_8_ = uVar24;
      auVar2._0_8_ = NVar32.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      local_3c8 = vmovlpd_avx(auVar2);
      local_3b8 = local_3c8;
      local_3b0 = local_3c0;
      local_388 = local_3c8;
      local_380 = local_3c0;
      local_378 = local_3c8;
      local_370 = local_3c0;
      NVar33 = pbrt::operator*(fVar36,(Tuple3<pbrt::Normal3,_float>)in_stack_fffffffffffff988);
      local_3e0 = NVar33.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar18._0_8_ = NVar33.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar18._8_56_ = auVar25;
      local_3e8 = vmovlpd_avx(auVar18._0_16_);
      c_00.super_Tuple3<pbrt::Normal3,_float>.z = local_3e0;
      c_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)local_3e8;
      c_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)local_3e8 >> 0x20);
      local_3d8 = local_3e8;
      local_3d0 = local_3e0;
      local_368 = local_3e8;
      local_360 = local_3e0;
      Tuple3<pbrt::Normal3,float>::operator+=((Tuple3<pbrt::Normal3,float> *)&local_98->nSum,c_00);
      local_430 = (local_30->ns).super_Tuple3<pbrt::Normal3,_float>.z;
      local_438._0_4_ = (local_30->ns).super_Tuple3<pbrt::Normal3,_float>.x;
      local_438._4_4_ = (local_30->ns).super_Tuple3<pbrt::Normal3,_float>.y;
      in_stack_fffffffffffff9c0 = (SampledSpectrum *)0x0;
      n_01.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffaa8;
      n_01.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffffaa0;
      n_01.super_Tuple3<pbrt::Normal3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
      in_stack_fffffffffffff9b4 = local_34;
      local_428 = local_438;
      local_420 = local_430;
      NVar32 = AnimatedTransform::operator()
                         (in_stack_fffffffffffffa88,n_01,in_stack_fffffffffffffa84);
      local_450 = NVar32.super_Tuple3<pbrt::Normal3,_float>.z;
      in_stack_fffffffffffff9b8 = NVar32.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar25 = (undefined1  [56])0x0;
      auVar3._8_8_ = in_stack_fffffffffffff9c0;
      auVar3._0_8_ = in_stack_fffffffffffff9b8;
      local_458 = vmovlpd_avx(auVar3);
      local_448 = local_458;
      local_440 = local_450;
      local_418 = local_458;
      local_410 = local_450;
      local_408 = local_458;
      local_400 = local_450;
      NVar33 = pbrt::operator*(fVar36,(Tuple3<pbrt::Normal3,_float>)in_stack_fffffffffffff988);
      local_470 = NVar33.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar19._0_8_ = NVar33.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar19._8_56_ = auVar25;
      local_478 = vmovlpd_avx(auVar19._0_16_);
      NVar33.super_Tuple3<pbrt::Normal3,_float>.z = local_470;
      NVar33.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)local_478;
      NVar33.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)local_478 >> 0x20);
      local_468 = local_478;
      local_460 = local_470;
      local_3f8 = local_478;
      local_3f0 = local_470;
      Tuple3<pbrt::Normal3,float>::operator+=
                ((Tuple3<pbrt::Normal3,float> *)&local_98->nsSum,NVar33);
      fVar36 = local_34;
      local_4a0 = (local_30->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
      local_4a8._0_4_ = (local_30->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
      local_4a8._4_4_ = (local_30->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
      uVar24 = 0;
      VVar34.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffaa8;
      VVar34.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffaa0;
      VVar34.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
      local_498 = local_4a8;
      local_490 = local_4a0;
      VVar34 = AnimatedTransform::operator()
                         (in_stack_fffffffffffffa88,VVar34,in_stack_fffffffffffffa84);
      fVar37 = local_34;
      local_4b0 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar4._8_8_ = uVar24;
      auVar4._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_4b8 = vmovlpd_avx(auVar4);
      local_98->dzdxSum = local_98->dzdxSum + fVar36 * local_4b0;
      local_4d8 = (local_30->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
      local_4e0._0_4_ = (local_30->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
      local_4e0._4_4_ = (local_30->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
      uVar24 = 0;
      v_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffaa8;
      v_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffaa0;
      v_01.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
      local_4d0 = local_4e0;
      local_4c8 = local_4d8;
      local_488 = local_4b8;
      local_480 = local_4b0;
      VVar34 = AnimatedTransform::operator()
                         (in_stack_fffffffffffffa88,v_01,in_stack_fffffffffffffa84);
      local_4e8 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar5._8_8_ = uVar24;
      auVar5._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_4f0 = vmovlpd_avx(auVar5);
      local_98->dzdySum = fVar37 * local_4e8 + local_98->dzdySum;
      local_4c4 = local_4f0;
      local_4bc = local_4e8;
    }
    else {
      local_e8 = (local_30->p).super_Tuple3<pbrt::Point3,_float>.z;
      local_f0._0_4_ = (local_30->p).super_Tuple3<pbrt::Point3,_float>.x;
      local_f0._4_4_ = (local_30->p).super_Tuple3<pbrt::Point3,_float>.y;
      uVar24 = 0;
      p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffa74;
      p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffa70;
      p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffa78;
      local_e0 = local_f0;
      local_d8 = local_e8;
      PVar30 = AnimatedTransform::ApplyInverse
                         (in_stack_fffffffffffffa58,p_00,in_stack_fffffffffffffa54);
      local_108 = PVar30.super_Tuple3<pbrt::Point3,_float>.z;
      auVar25 = (undefined1  [56])0x0;
      auVar6._8_8_ = uVar24;
      auVar6._0_8_ = PVar30.super_Tuple3<pbrt::Point3,_float>._0_8_;
      local_110 = vmovlpd_avx(auVar6);
      local_100 = local_110;
      local_f8 = local_108;
      local_d0 = local_110;
      local_c8 = local_108;
      local_c0 = local_110;
      local_b8 = local_108;
      PVar31 = pbrt::operator*(in_stack_fffffffffffff974,in_stack_fffffffffffff988);
      local_128 = PVar31.super_Tuple3<pbrt::Point3,_float>.z;
      auVar14._0_8_ = PVar31.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar14._8_56_ = auVar25;
      local_130 = vmovlpd_avx(auVar14._0_16_);
      c_03.super_Tuple3<pbrt::Point3,_float>.z = local_128;
      c_03.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_130;
      c_03.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)local_130 >> 0x20);
      local_120 = local_130;
      local_118 = local_128;
      local_b0 = local_130;
      local_a8 = local_128;
      Tuple3<pbrt::Point3,float>::operator+=((Tuple3<pbrt::Point3,float> *)&local_98->pSum,c_03);
      local_178 = (local_30->n).super_Tuple3<pbrt::Normal3,_float>.z;
      local_180._0_4_ = (local_30->n).super_Tuple3<pbrt::Normal3,_float>.x;
      local_180._4_4_ = (local_30->n).super_Tuple3<pbrt::Normal3,_float>.y;
      uVar24 = 0;
      n.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffa74;
      n.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffa70;
      n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffa78;
      local_170 = local_180;
      local_168 = local_178;
      NVar32 = AnimatedTransform::ApplyInverse
                         (in_stack_fffffffffffffa58,n,in_stack_fffffffffffffa54);
      local_198 = NVar32.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar25 = (undefined1  [56])0x0;
      auVar7._8_8_ = uVar24;
      auVar7._0_8_ = NVar32.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      local_1a0 = vmovlpd_avx(auVar7);
      local_190 = local_1a0;
      local_188 = local_198;
      local_160 = local_1a0;
      local_158 = local_198;
      local_150 = local_1a0;
      local_148 = local_198;
      NVar33 = pbrt::operator*(in_stack_fffffffffffff974,
                               (Tuple3<pbrt::Normal3,_float>)in_stack_fffffffffffff988);
      local_1b8 = NVar33.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar15._0_8_ = NVar33.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar15._8_56_ = auVar25;
      local_1c0 = vmovlpd_avx(auVar15._0_16_);
      c_02.super_Tuple3<pbrt::Normal3,_float>.z = local_1b8;
      c_02.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)local_1c0;
      c_02.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)local_1c0 >> 0x20);
      local_1b0 = local_1c0;
      local_1a8 = local_1b8;
      local_140 = local_1c0;
      local_138 = local_1b8;
      Tuple3<pbrt::Normal3,float>::operator+=((Tuple3<pbrt::Normal3,float> *)&local_98->nSum,c_02);
      local_208 = (local_30->ns).super_Tuple3<pbrt::Normal3,_float>.z;
      local_210._0_4_ = (local_30->ns).super_Tuple3<pbrt::Normal3,_float>.x;
      local_210._4_4_ = (local_30->ns).super_Tuple3<pbrt::Normal3,_float>.y;
      uVar24 = 0;
      n_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffa74;
      n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffa70;
      n_00.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffa78;
      fVar37 = local_34;
      local_200 = local_210;
      local_1f8 = local_208;
      NVar32 = AnimatedTransform::ApplyInverse(in_stack_fffffffffffffa58,n_00,local_34);
      local_228 = NVar32.super_Tuple3<pbrt::Normal3,_float>.z;
      this_00 = NVar32.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar25 = (undefined1  [56])0x0;
      auVar8._8_8_ = uVar24;
      auVar8._0_8_ = this_00;
      local_230 = vmovlpd_avx(auVar8);
      local_220 = local_230;
      local_218 = local_228;
      local_1f0 = local_230;
      local_1e8 = local_228;
      local_1e0 = local_230;
      local_1d8 = local_228;
      NVar33 = pbrt::operator*(in_stack_fffffffffffff974,
                               (Tuple3<pbrt::Normal3,_float>)in_stack_fffffffffffff988);
      local_248 = NVar33.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar16._0_8_ = NVar33.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar16._8_56_ = auVar25;
      local_250 = vmovlpd_avx(auVar16._0_16_);
      c_01.super_Tuple3<pbrt::Normal3,_float>.z = local_248;
      c_01.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)local_250;
      c_01.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)local_250 >> 0x20);
      local_240 = local_250;
      local_238 = local_248;
      local_1d0 = local_250;
      local_1c8 = local_248;
      Tuple3<pbrt::Normal3,float>::operator+=((Tuple3<pbrt::Normal3,float> *)&local_98->nsSum,c_01);
      local_278 = (local_30->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
      local_280._0_4_ = (local_30->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
      local_280._4_4_ = (local_30->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
      uVar24 = 0;
      v.super_Tuple3<pbrt::Vector3,_float>.y = local_34;
      v.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa70;
      v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa78;
      fVar38 = local_34;
      local_270 = local_280;
      local_268 = local_278;
      VVar34 = AnimatedTransform::ApplyInverse(this_00,v,fVar37);
      fVar36 = local_34;
      local_288 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
      uStack_580 = (undefined4)uVar24;
      auVar9._8_4_ = uStack_580;
      auVar9._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar9._12_4_ = (int)((ulong)uVar24 >> 0x20);
      local_290 = vmovlpd_avx(auVar9);
      local_98->dzdxSum = local_98->dzdxSum + fVar38 * local_288;
      local_2b0 = (local_30->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
      local_2b8._0_4_ = (local_30->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
      local_2b8._4_4_ = (local_30->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
      uVar24 = 0;
      v_00.super_Tuple3<pbrt::Vector3,_float>.y = fVar38;
      v_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa70;
      v_00.super_Tuple3<pbrt::Vector3,_float>.z = VVar34.super_Tuple3<pbrt::Vector3,_float>.x;
      local_2a8 = local_2b8;
      local_2a0 = local_2b0;
      local_260 = local_290;
      local_258 = local_288;
      VVar34 = AnimatedTransform::ApplyInverse(this_00,v_00,fVar37);
      local_2c0 = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar10._8_8_ = uVar24;
      auVar10._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_2c8 = vmovlpd_avx(auVar10);
      local_98->dzdySum = fVar36 * local_2c0 + local_98->dzdySum;
      local_29c = local_2c8;
      local_294 = local_2c0;
    }
    local_500 = (local_30->uv).super_Tuple2<pbrt::Point2,_float>;
    auVar28 = (undefined1  [56])0x0;
    auVar20._0_8_ = pbrt::operator*(0.0,in_stack_fffffffffffff958);
    auVar20._8_56_ = extraout_var;
    local_4f8 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar20._0_16_);
    auVar25 = ZEXT856(0);
    Tuple2<pbrt::Point2,float>::operator+=
              ((Tuple2<pbrt::Point2,float> *)&local_98->uvSum,(Point2<float>)local_4f8);
    this_01 = &local_30->albedo;
    SVar35 = DenselySampledSpectrum::Sample(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    auVar26._0_8_ = SVar35.values.values._8_8_;
    auVar26._8_56_ = auVar28;
    auVar21._0_8_ = SVar35.values.values._0_8_;
    auVar21._8_56_ = auVar25;
    local_520 = vmovlpd_avx(auVar21._0_16_);
    local_518 = vmovlpd_avx(auVar26._0_16_);
    SVar35 = SampledSpectrum::operator*
                       (this_01,(SampledSpectrum *)
                                CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    auVar27._0_8_ = SVar35.values.values._8_8_;
    auVar27._8_56_ = auVar28;
    auVar22._0_8_ = SVar35.values.values._0_8_;
    auVar22._8_56_ = auVar25;
    local_510 = vmovlpd_avx(auVar22._0_16_);
    local_508 = vmovlpd_avx(auVar27._0_16_);
    RVar29 = SampledSpectrum::ToRGB
                       (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                        (RGBColorSpace *)
                        CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    local_52c.b = RVar29.b;
    auVar23._0_8_ = RVar29._0_8_;
    auVar23._8_56_ = auVar25;
    local_52c._0_8_ = vmovlpd_avx(auVar23._0_16_);
    for (local_544 = 0; local_544 < 3; local_544 = local_544 + 1) {
      fVar36 = local_34;
      pFVar12 = RGB::operator[](&local_52c,local_544);
      local_98->rgbAlbedoSum[local_544] =
           (double)(fVar36 * *pFVar12) + local_98->rgbAlbedoSum[local_544];
    }
  }
  for (local_548 = 0; local_548 < 3; local_548 = local_548 + 1) {
    pFVar12 = RGB::operator[](&local_40,local_548);
    local_98->rgbSum[local_548] = (double)(*pFVar12 * local_34) + local_98->rgbSum[local_548];
  }
  local_98->weightSum = (double)local_34 + local_98->weightSum;
  return;
}

Assistant:

PBRT_CPU_GPU void GBufferFilm::AddSample(Point2i pFilm, SampledSpectrum L,
                            const SampledWavelengths &lambda,
                            const VisibleSurface *visibleSurface, Float weight) {
    RGB rgb = sensor->ToSensorRGB(L, lambda);
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    if (m > maxComponentValue)
        rgb *= maxComponentValue / m;

    Pixel &p = pixels[pFilm];
    if (visibleSurface && *visibleSurface) {
        p.gBufferWeightSum += weight;

        // Update variance estimates.
        for (int c = 0; c < 3; ++c)
            p.rgbVariance[c].Add(rgb[c]);

        if (applyInverse) {
            p.pSum += weight * outputFromRender.ApplyInverse(visibleSurface->p,
                                                             visibleSurface->time);
            p.nSum += weight * outputFromRender.ApplyInverse(visibleSurface->n,
                                                             visibleSurface->time);
            p.nsSum += weight * outputFromRender.ApplyInverse(visibleSurface->ns,
                                                              visibleSurface->time);
            p.dzdxSum +=
                weight *
                outputFromRender.ApplyInverse(visibleSurface->dpdx, visibleSurface->time)
                    .z;
            p.dzdySum +=
                weight *
                outputFromRender.ApplyInverse(visibleSurface->dpdy, visibleSurface->time)
                    .z;
        } else {
            p.pSum += weight * outputFromRender(visibleSurface->p, visibleSurface->time);
            p.nSum += weight * outputFromRender(visibleSurface->n, visibleSurface->time);
            p.nsSum +=
                weight * outputFromRender(visibleSurface->ns, visibleSurface->time);
            p.dzdxSum +=
                weight * outputFromRender(visibleSurface->dpdx, visibleSurface->time).z;
            p.dzdySum +=
                weight * outputFromRender(visibleSurface->dpdy, visibleSurface->time).z;
        }
        p.uvSum += weight * visibleSurface->uv;

        SampledSpectrum albedo =
            visibleSurface->albedo * colorSpace->illuminant.Sample(lambda);
        RGB albedoRGB = albedo.ToRGB(lambda, *colorSpace);
        for (int c = 0; c < 3; ++c)
            p.rgbAlbedoSum[c] += weight * albedoRGB[c];
    }

    for (int c = 0; c < 3; ++c)
        p.rgbSum[c] += rgb[c] * weight;
    p.weightSum += weight;
}